

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O2

bool_t hexEq(void *buf,char *hex)

{
  size_t sVar1;
  size_t sVar2;
  byte bVar3;
  
  sVar1 = strLen(hex);
  bVar3 = 0;
  for (sVar2 = 0; sVar1 != sVar2; sVar2 = sVar2 + 2) {
    bVar3 = bVar3 | (hex_dec_table[(byte)hex[sVar2]] << 4 | hex_dec_table[(byte)hex[sVar2 + 1]]) ^
                    *buf;
    buf = (void *)((long)buf + 1);
  }
  return (bool_t)(bVar3 == 0);
}

Assistant:

bool_t SAFE(hexEq)(const void* buf, const char* hex)
{
	register word diff = 0;
	size_t count;
	ASSERT(hexIsValid(hex));
	ASSERT(memIsValid(buf, strLen(hex) / 2));
	count = strLen(hex);
	for (; count; count -= 2, hex += 2, buf = (const octet*)buf + 1)
		diff |= *(const octet*)buf ^ hexToO(hex);
	return wordEq(diff, 0);
}